

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void ReadableSizeString(size_t SizeInBytes,char *Output,size_t size)

{
  size_t in_RDX;
  char *in_RSI;
  ulong in_RDI;
  undefined1 auVar1 [16];
  char *byteUnits [9];
  size_t LastSizeInBytes;
  int i;
  undefined8 auStack_78 [10];
  ulong local_28;
  int local_1c;
  size_t local_18;
  char *local_10;
  ulong local_8;
  
  local_1c = 0;
  local_28 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(auStack_78,&DAT_01139cc0,0x48);
  for (; 0x400 < local_8; local_8 = local_8 >> 10) {
    local_28 = local_8;
    local_1c = local_1c + 1;
  }
  if ((local_8 < 100) && (local_1c != 0)) {
    auVar1._8_4_ = (int)(local_28 >> 0x20);
    auVar1._0_8_ = local_28;
    auVar1._12_4_ = 0x45300000;
    snprintf(local_10,local_18,"%.1f %s",
             ((auVar1._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0)) / 1024.0,
             auStack_78[local_1c]);
  }
  else {
    snprintf(local_10,local_18,"%zd %s",local_8,auStack_78[local_1c]);
  }
  return;
}

Assistant:

static void ReadableSizeString(size_t SizeInBytes, char *Output, size_t size)
{
    int i = 0;
    size_t LastSizeInBytes = SizeInBytes;
    char *byteUnits[] = {"bytes", "kB", "MB", "GB", "TB", "PB", "EB", "ZB", "YB"};

    while (SizeInBytes > 1024)
    {
        LastSizeInBytes = SizeInBytes;
        SizeInBytes = SizeInBytes / 1024;
        i++;
    }

    if ((SizeInBytes < 100) && (i != 0))
    {
        snprintf(Output, size, "%.1f %s", ((double)LastSizeInBytes) / 1024, byteUnits[i]);
    }
    else
    {
        snprintf(Output, size, "%zd %s", SizeInBytes, byteUnits[i]);
    }
}